

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall DebugLogHelper::DebugLogHelper(DebugLogHelper *this,string message,MatchFn match)

{
  long lVar1;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Logger *this_00;
  iterator iVar2;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)this,in_RSI);
  this->m_found = false;
  (this->m_print_connection)._M_node = (_List_node_base *)0x0;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::function(&this->m_match,in_RDX);
  this_00 = LogInstance();
  fun.super__Function_base._M_functor._8_8_ = this;
  fun.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffffb8;
  fun.super__Function_base._M_manager = (_Manager_type)0x0;
  fun._M_invoker =
       std::
       _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.cpp:17:9)>
       ::_M_manager;
  iVar2 = BCLog::Logger::PushBackCallback(this_00,fun);
  (this->m_print_connection)._M_node = iVar2._M_node;
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffc0);
  noui_test_redirect();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DebugLogHelper::DebugLogHelper(std::string message, MatchFn match)
    : m_message{std::move(message)}, m_match(std::move(match))
{
    m_print_connection = LogInstance().PushBackCallback(
        [this](const std::string& s) {
            if (m_found) return;
            m_found = s.find(m_message) != std::string::npos && m_match(&s);
        });
    noui_test_redirect();
}